

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O0

double __thiscall internalJSONNode::operator_cast_to_double(internalJSONNode *this)

{
  uchar uVar1;
  json_string *__lhs;
  double local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  internalJSONNode *local_18;
  internalJSONNode *this_local;
  
  local_18 = this;
  Fetch(this);
  uVar1 = type(this);
  if (uVar1 == '\0') {
    this_local = (internalJSONNode *)0x0;
  }
  else {
    if (uVar1 == '\x01') {
      FetchNumber(this);
    }
    else if (uVar1 == '\x03') {
      local_58 = 1.0;
      if (((this->_value)._bool & 1U) == 0) {
        local_58 = 0.0;
      }
      return local_58;
    }
    uVar1 = type(this);
    __lhs = jsonSingletonERROR_UNDEFINED::getValue_abi_cxx11_();
    std::operator+(&local_38,__lhs,"(double)");
    JSONDebug::_JSON_ASSERT(uVar1 == '\x02',&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    this_local = *(internalJSONNode **)&this->_value;
  }
  return (double)this_local;
}

Assistant:

internalJSONNode::operator double() const json_nothrow {
		  Fetch();
		  #ifdef JSON_CASTABLE /*-> JSON_CASTABLE */
			 switch(type()){
				case JSON_NULL:
				    return (double)0.0;
				case JSON_BOOL:
				    return (double)(_value._bool ? 1.0 : 0.0);
				case JSON_STRING:
				    FetchNumber();
			 }
		  #endif /*<- */
		  JSON_ASSERT(type() == JSON_NUMBER, json_global(ERROR_UNDEFINED) + JSON_TEXT("(double)"));
		  return (double)_value._number;
	   }